

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

SUNErrCode SUNNonlinSolInitialize_Newton(SUNNonlinearSolver NLS)

{
  SUNContext_conflict sunctx_local_scope_;
  SUNNonlinearSolver NLS_local;
  
  *(undefined8 *)((long)NLS->content + 0x38) = 0;
  *(undefined8 *)((long)NLS->content + 0x40) = 0;
  *(undefined4 *)((long)NLS->content + 0x28) = 0;
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolInitialize_Newton(SUNNonlinearSolver NLS)
{
  SUNFunctionBegin(NLS->sunctx);
  /* check that all required function pointers have been set */
  SUNAssert(NEWTON_CONTENT(NLS)->Sys && NEWTON_CONTENT(NLS)->CTest &&
              NEWTON_CONTENT(NLS)->LSolve,
            SUN_ERR_ARG_CORRUPT);

  /* reset the total number of iterations and convergence failures */
  NEWTON_CONTENT(NLS)->niters     = 0;
  NEWTON_CONTENT(NLS)->nconvfails = 0;

  /* reset the Jacobian status */
  NEWTON_CONTENT(NLS)->jcur = SUNFALSE;

  return SUN_SUCCESS;
}